

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquery.cpp
# Opt level: O0

void qInit(QSqlQuery *q,QString *query,QSqlDatabase *db)

{
  bool bVar1;
  QSqlDriver *pQVar2;
  QSqlDatabase *in_RDX;
  QSqlResult *in_RSI;
  QSqlDatabase *in_RDI;
  long in_FS_OFFSET;
  QSqlDatabase database;
  QSqlDatabase *in_stack_ffffffffffffffa8;
  QString *in_stack_ffffffffffffffd8;
  QSqlQuery *in_stack_ffffffffffffffe0;
  QSqlDatabase local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.d = (QSqlDatabasePrivate *)0xaaaaaaaaaaaaaaaa;
  QSqlDatabase::QSqlDatabase(in_RDX,in_stack_ffffffffffffffa8);
  bVar1 = QSqlDatabase::isValid(in_RDI);
  if (!bVar1) {
    QSqlDatabaseDefaultConnectionName::defaultConnectionName();
    QSqlDatabase::database((QString *)in_RSI,SUB81((ulong)in_RDX >> 0x38,0));
    QSqlDatabase::operator=(in_RDX,in_stack_ffffffffffffffa8);
    QSqlDatabase::~QSqlDatabase(in_RDX);
    QString::~QString((QString *)0x1387e8);
  }
  bVar1 = QSqlDatabase::isValid(in_RDI);
  if (bVar1) {
    pQVar2 = QSqlDatabase::driver(&local_10);
    (**(code **)(*(long *)pQVar2 + 200))();
    QSqlQuery::QSqlQuery((QSqlQuery *)in_RDI,in_RSI);
    QSqlQuery::operator=((QSqlQuery *)in_RDI,(QSqlQuery *)in_RSI);
    QSqlQuery::~QSqlQuery((QSqlQuery *)in_RDX);
  }
  bVar1 = QString::isEmpty((QString *)0x13883e);
  if (!bVar1) {
    QSqlQuery::exec(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  QSqlDatabase::~QSqlDatabase(in_RDX);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void qInit(QSqlQuery *q, const QString& query, const QSqlDatabase &db)
{
    QSqlDatabase database = db;
    if (!database.isValid()) {
        database =
                QSqlDatabase::database(QSqlDatabase::defaultConnectionName(), false);
    }
    if (database.isValid())
        *q = QSqlQuery(database.driver()->createResult());

    if (!query.isEmpty())
        q->exec(query);
}